

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_buffer_block(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  SPIRType *pSVar4;
  const_iterator cVar5;
  uint uVar6;
  uint32_t local_1c;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  if (var->storage == StorageClassUniform) {
    bVar3 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,Block);
  }
  else {
    bVar3 = false;
  }
  local_1c = (var->super_IVariant).self.id;
  cVar5 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->flattened_buffer_blocks)._M_h,&local_1c);
  if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    bVar1 = (this->options).es;
    uVar6 = 0x81;
    if (bVar1 != false) {
      uVar6 = 299;
    }
    uVar2 = (this->options).version;
    if (((uVar2 == 0x82 & (bVar1 ^ 1U)) == 0 && uVar6 < uVar2) &&
       ((bVar3 == false || ((this->options).emit_uniform_buffer_as_plain_uniforms != true)))) {
      emit_buffer_block_native(this,var);
    }
    else {
      emit_buffer_block_legacy(this,var);
    }
  }
  else {
    emit_buffer_block_flattened(this,var);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	bool ubo_block = var.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock);

	if (flattened_buffer_blocks.count(var.self))
		emit_buffer_block_flattened(var);
	else if (is_legacy() || (!options.es && options.version == 130) ||
	         (ubo_block && options.emit_uniform_buffer_as_plain_uniforms))
		emit_buffer_block_legacy(var);
	else
		emit_buffer_block_native(var);
}